

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Tuple_impl<0UL,_testing::internal::ValueArray<const_char_*>,_testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<const_char_*>_>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> PVar2;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  local_40;
  
  __p = (ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>
         *)operator_new(0x28);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<std::tuple<char_const*,char_const*>>>
  ::
  _Tuple_impl<testing::internal::ValueArray<char_const*>,testing::internal::CartesianProductHolder<testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<char_const*>>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<char_const*>,testing::internal::ParamGenerator<std::tuple<char_const*,char_const*>>>
              *)&local_40,in_RSI);
  __p->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_006e4400;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::ParamGenerator<const_char_*>,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
                 *)(__p + 1),&local_40);
  *(ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_> **)
   this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParamGeneratorInterface<std::tuple<char_const*,std::tuple<char_const*,char_const*>>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (local_40.super__Head_base<0UL,_testing::internal::ParamGenerator<const_char_*>,_false>.
      _M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super__Head_base<0UL,_testing::internal::ParamGenerator<const_char_*>,_false>.
               _M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_40.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
      .
      super__Head_base<1UL,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>,_false>
      ._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_const_char_*>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>_>
               .
               super__Head_base<1UL,_testing::internal::ParamGenerator<std::tuple<const_char_*,_const_char_*>_>,_false>
               ._M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_const_char_*>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }